

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::GlobOperator,bool,true,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char **ppcVar6;
  idx_t iVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char **local_88;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  string_t *local_60;
  bool *local_58;
  ulong local_50;
  ulong local_48;
  unsigned_long *local_40;
  ulong local_38;
  
  local_40 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_60 = ldata;
  local_58 = result_data;
  if (local_40 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar11 = *(ulong *)&ldata->value;
      pcVar8 = (ldata->value).pointer.ptr;
      local_88 = &(rdata->value).pointer.ptr;
      iVar7 = 0;
      uVar9 = uVar11 & 0xffffffff;
      local_40 = (unsigned_long *)0x0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_88 + -1);
        local_80._0_4_ = paVar1->length;
        local_80._4_1_ = paVar1->prefix[0];
        local_80._5_1_ = paVar1->prefix[1];
        local_80._6_1_ = paVar1->prefix[2];
        local_80._7_1_ = paVar1->prefix[3];
        local_78 = *local_88;
        pcVar4 = pcVar8;
        if (uVar9 < 0xd) {
          pcVar4 = (char *)((long)&local_70 + 4);
        }
        pcVar3 = local_78;
        if ((local_80 & 0xffffffff) < 0xd) {
          pcVar3 = (char *)((long)&local_80 + 4);
        }
        local_70 = uVar11;
        local_68 = pcVar8;
        bVar2 = Glob(pcVar4,uVar9,pcVar3,local_80 & 0xffffffff,true);
        local_58[iVar7] = bVar2;
        iVar7 = iVar7 + 1;
        local_88 = local_88 + 2;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_38 = 0;
    uVar11 = 0;
    local_48 = count;
    do {
      uVar9 = local_40[local_38];
      uVar5 = uVar11 + 0x40;
      if (local_48 <= uVar11 + 0x40) {
        uVar5 = local_48;
      }
      uVar12 = uVar5;
      if (uVar9 != 0) {
        uVar12 = uVar11;
        if (uVar9 == 0xffffffffffffffff) {
          if (uVar11 < uVar5) {
            uVar9 = *(ulong *)&local_60->value;
            pcVar8 = (local_60->value).pointer.ptr;
            ppcVar6 = &rdata[uVar11].value.pointer.ptr;
            uVar10 = uVar9 & 0xffffffff;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar6 + -1);
              local_80._0_4_ = paVar1->length;
              local_80._4_1_ = paVar1->prefix[0];
              local_80._5_1_ = paVar1->prefix[1];
              local_80._6_1_ = paVar1->prefix[2];
              local_80._7_1_ = paVar1->prefix[3];
              local_78 = *ppcVar6;
              pcVar4 = pcVar8;
              if (uVar10 < 0xd) {
                pcVar4 = (char *)((long)&local_70 + 4);
              }
              pcVar3 = local_78;
              if ((local_80 & 0xffffffff) < 0xd) {
                pcVar3 = (char *)((long)&local_80 + 4);
              }
              local_70 = uVar9;
              local_68 = pcVar8;
              bVar2 = Glob(pcVar4,uVar10,pcVar3,local_80 & 0xffffffff,true);
              local_58[uVar11] = bVar2;
              uVar11 = uVar11 + 1;
              ppcVar6 = ppcVar6 + 2;
              uVar12 = uVar11;
            } while (uVar5 != uVar11);
          }
        }
        else if (uVar11 < uVar5) {
          ppcVar6 = &rdata[uVar11].value.pointer.ptr;
          uVar10 = 0;
          do {
            if ((uVar9 >> (uVar10 & 0x3f) & 1) != 0) {
              local_70 = *(ulong *)&local_60->value;
              local_68 = (local_60->value).pointer.ptr;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar6 + -1);
              local_80._0_4_ = paVar1->length;
              local_80._4_1_ = paVar1->prefix[0];
              local_80._5_1_ = paVar1->prefix[1];
              local_80._6_1_ = paVar1->prefix[2];
              local_80._7_1_ = paVar1->prefix[3];
              local_78 = *ppcVar6;
              pcVar8 = local_68;
              if ((local_70 & 0xffffffff) < 0xd) {
                pcVar8 = (char *)((long)&local_70 + 4);
              }
              pcVar4 = local_78;
              if ((local_80 & 0xffffffff) < 0xd) {
                pcVar4 = (char *)((long)&local_80 + 4);
              }
              bVar2 = Glob(pcVar8,local_70 & 0xffffffff,pcVar4,local_80 & 0xffffffff,true);
              local_58[uVar11] = bVar2;
            }
            uVar11 = uVar11 + 1;
            ppcVar6 = ppcVar6 + 2;
            uVar10 = uVar10 + 1;
            uVar12 = uVar11;
          } while (uVar5 != uVar11);
        }
      }
      local_38 = local_38 + 1;
      uVar11 = uVar12;
    } while (local_38 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}